

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_diff.hpp
# Opt level: O2

Diffs * __thiscall
MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
diff_bisectSplit(Diffs *__return_storage_ptr__,
                MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,Range text1,Range text2,int x,int y,Time deadline)

{
  Range text1_00;
  Range text2_00;
  Range text1_01;
  Range text2_01;
  Diffs diffsb;
  _Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  local_68;
  Range local_50;
  Range local_40;
  
  local_50.till = text2.till._M_current;
  local_50.from = text2.from._M_current;
  local_40.till = text1.till._M_current;
  local_40.from = text1.from._M_current;
  text1_00 = Range::substr(&local_40,0,(long)x);
  text2_00 = Range::substr(&local_50,0,(long)y);
  text1_01 = Range::substr(&local_40,(long)x);
  text2_01 = Range::substr(&local_50,(long)y);
  diff_main(__return_storage_ptr__,this,text1_00,text2_00,deadline);
  diff_main((Diffs *)&local_68,this,text1_01,text2_01,deadline);
  std::
  vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
  ::
  insert<__gnu_cxx::__normal_iterator<MyersDiff<std::__cxx11::string>::Diff*,std::vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>>,void>
            ((vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
              *)__return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff_*,_std::vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>_>
              )local_68._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff_*,_std::vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>_>
              )local_68._M_impl.super__Vector_impl_data._M_finish);
  std::
  _Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  ::~_Vector_base(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Diffs diff_bisectSplit(Range text1, Range text2, int x, int y,
                           Time deadline) {
        Range text1a = text1.substr(0, x);
        Range text2a = text2.substr(0, y);
        Range text1b = text1.substr(x);
        Range text2b = text2.substr(y);

        // Compute both diffs serially.
        Diffs diffs = diff_main(text1a, text2a, deadline);
        Diffs diffsb = diff_main(text1b, text2b, deadline);

        diffs.insert(diffs.end(), diffsb.begin(), diffsb.end());
        return diffs;
    }